

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_marshal.c
# Opt level: O0

SstStatusValue WaitForReadRequests(SstStream Stream)

{
  void *pvVar1;
  SstStatusValue SVar2;
  SstStream in_RDI;
  SstStatusValue Result;
  int i;
  FFSReaderMarshalBase *Info;
  int in_stack_0000005c;
  SstStream in_stack_00000060;
  SstStream in_stack_ffffffffffffffd8;
  int local_1c;
  
  pvVar1 = in_RDI->ReaderMarshalData;
  local_1c = 0;
  do {
    if (in_RDI->WriterCohortSize <= local_1c) {
      CP_verbose(in_RDI,TraceVerbose,"All remote memory reads completed\n");
      return SstSuccess;
    }
    if (*(int *)(*(long *)((long)pvVar1 + 0x40) + (long)local_1c * 0x18) == 2) {
      SVar2 = SstWaitForCompletion(in_stack_ffffffffffffffd8,(void *)0xf5d228);
      if (SVar2 != SstSuccess) {
        CP_verbose(in_RDI,CriticalVerbose,
                   "Wait for remote read completion failed, returning failure\n");
        return SVar2;
      }
      *(undefined4 *)(*(long *)((long)pvVar1 + 0x40) + (long)local_1c * 0x18) = 3;
      if (in_RDI->ConfigParams->ReaderShortCircuitReads == 0) {
        DecodeAndPrepareData(in_stack_00000060,in_stack_0000005c);
      }
    }
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

static SstStatusValue WaitForReadRequests(SstStream Stream)
{
    struct FFSReaderMarshalBase *Info = Stream->ReaderMarshalData;

    for (int i = 0; i < Stream->WriterCohortSize; i++)
    {
        if (Info->WriterInfo[i].Status == Requested)
        {
            SstStatusValue Result = SstWaitForCompletion(Stream, Info->WriterInfo[i].ReadHandle);
            if (Result == SstSuccess)
            {
                Info->WriterInfo[i].Status = Full;
                if (!Stream->ConfigParams->ReaderShortCircuitReads)
                    DecodeAndPrepareData(Stream, i);
            }
            else
            {
                CP_verbose(Stream, CriticalVerbose,
                           "Wait for remote read completion failed, "
                           "returning failure\n");
                return Result;
            }
        }
    }
    CP_verbose(Stream, TraceVerbose, "All remote memory reads completed\n");
    return SstSuccess;
}